

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_config.c
# Opt level: O0

int mpt_client_config(mpt_config *cfg,mpt_logger *info)

{
  int iVar1;
  char *val_00;
  int local_44;
  int ret;
  char *str;
  void *ptr;
  mpt_value *val;
  mpt_iterator *it;
  mpt_logger *info_local;
  mpt_config *cfg_local;
  
  val = (mpt_value *)0x0;
  it = (mpt_iterator *)info;
  info_local = (mpt_logger *)cfg;
  iVar1 = mpt_config_get((mpt_config *)0x0,"mpt.args",0x86,&val);
  if ((iVar1 < 1) || (val == (mpt_value *)0x0)) {
    cfg_local._4_4_ = 0;
  }
  else {
    ptr = (void *)(**val->_addr)(val);
    if ((undefined8 *)ptr == (undefined8 *)0x0) {
      mpt_log((mpt_logger *)it,"mpt_client_config",8,"%s","no client config filename");
      cfg_local._4_4_ = 0;
    }
    else {
      str = *ptr;
      val_00 = mpt_data_tostring(&str,*(mpt_type_t *)((long)ptr + 8),(size_t *)0x0);
      if (val_00 == (char *)0x0) {
        mpt_log((mpt_logger *)it,"mpt_client_config",3,"%s","bad client config filename");
        cfg_local._4_4_ = iVar1;
      }
      else {
        iVar1 = mpt_config_set((mpt_config *)info_local,(char *)0x0,val_00,0,0);
        if (iVar1 < 0) {
          mpt_log((mpt_logger *)it,"mpt_client_config",3,"%s: %s","failed to set client config",
                  val_00);
          cfg_local._4_4_ = iVar1;
        }
        else {
          if (it == (mpt_iterator *)0x0) {
            it = (mpt_iterator *)mpt_log_default();
          }
          local_44 = (**(code **)((long)val->_addr + 8))(val);
          if (((0 < local_44) &&
              (local_44 = mpt_config_args((mpt_config *)info_local,(mpt_iterator *)val,
                                          (mpt_logger *)it), local_44 != 0)) && (-1 < local_44)) {
            local_44 = local_44 + 1;
          }
          cfg_local._4_4_ = local_44;
        }
      }
    }
  }
  return cfg_local._4_4_;
}

Assistant:

extern int mpt_client_config(MPT_INTERFACE(config) *cfg, MPT_INTERFACE(logger) *info)
{
	MPT_INTERFACE(iterator) *it;
	const MPT_STRUCT(value) *val;
	const void *ptr;
	const char *str;
	int ret;
	
	it = 0;
	if ((ret = mpt_config_get(0, "mpt.args", MPT_ENUM(TypeIteratorPtr), &it)) <= 0
	    || !it) {
		return 0;
	}
	/* set config file */
	if (!(val = it->_vptr->value(it))) {
		mpt_log(info, __func__, MPT_LOG(Info), "%s",
		        MPT_tr("no client config filename"));
		return 0;
	}
	ptr = val->_addr;
	if (!(str = mpt_data_tostring(&ptr, val->_type, 0))) {
		mpt_log(info, __func__, MPT_LOG(Error), "%s",
		        MPT_tr("bad client config filename"));
		return ret;
	}
	if ((ret = mpt_config_set(cfg, 0, str, 0, 0)) < 0) {
		mpt_log(info, __func__, MPT_LOG(Error), "%s: %s",
		        MPT_tr("failed to set client config"), str);
		return ret;
	}
	if (!info) {
		info = mpt_log_default();
	}
	/* apply config settings */
	if ((ret = it->_vptr->advance(it)) > 0
	    && (ret = mpt_config_args(cfg, it, info))) {
		if (ret >= 0) {
			++ret;
		}
	}
	return ret;
}